

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Vector3<float>
pbrt::DifferenceOfProducts<float,pbrt::Vector3<float>,float,pbrt::Vector3<float>>
          (float a,Vector3<float> b,float c,Vector3<float> d)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  Vector3<float> VVar12;
  
  auVar8._4_60_ = in_register_000012c4;
  auVar8._0_4_ = c;
  auVar4._4_60_ = in_register_00001204;
  auVar4._0_4_ = a;
  auVar10._4_60_ = d._12_60_;
  auVar10._0_4_ = d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._8_56_ = d._8_56_;
  auVar9._0_8_ = d.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._4_60_ = b._12_60_;
  auVar6._0_4_ = b.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._8_56_ = b._8_56_;
  auVar5._0_8_ = b.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2 = vfnmadd213ss_fma(auVar10._0_16_,auVar8._0_16_,ZEXT416((uint)(c * auVar10._0_4_)));
  auVar7._4_4_ = c;
  auVar7._0_4_ = c;
  auVar7._8_4_ = c;
  auVar7._12_4_ = c;
  auVar1 = vfmsub213ss_fma(auVar6._0_16_,auVar4._0_16_,ZEXT416((uint)(c * auVar10._0_4_)));
  auVar3._4_4_ = a;
  auVar3._0_4_ = a;
  auVar3._8_4_ = a;
  auVar3._12_4_ = a;
  auVar11._0_4_ = c * d.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar11._4_4_ = c * d.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar11._8_4_ = c * d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._12_4_ = c * d._12_4_;
  auVar3 = vfmsub213ps_fma(auVar3,auVar5._0_16_,auVar11);
  auVar7 = vfnmadd213ps_fma(auVar9._0_16_,auVar7,auVar11);
  VVar12.super_Tuple3<pbrt::Vector3,_float>.x = auVar3._0_4_ + auVar7._0_4_;
  VVar12.super_Tuple3<pbrt::Vector3,_float>.y = auVar3._4_4_ + auVar7._4_4_;
  VVar12.super_Tuple3<pbrt::Vector3,_float>.z = auVar1._0_4_ + auVar2._0_4_;
  return (Vector3<float>)VVar12.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU auto operator*(U s) const -> Child<decltype(T{} * U{})> {
        return {s * x, s * y, s * z};
    }